

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnStricmp_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnStricmp_Test *this)

{
  int *in_R9;
  iuCodeMessage local_1f8;
  AssertionResult iutest_ar;
  char negative_sample [5];
  Fixed local_198;
  
  negative_sample[4] = '\0';
  negative_sample[0] = 'a';
  negative_sample[1] = 'a';
  negative_sample[2] = 'a';
  negative_sample[3] = -1;
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f8.m_message._M_dataplus._M_p._0_4_ = iutest::detail::wrapper::iu_stricmp("AAA","aaa");
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x169a26,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaa\")",(char *)&local_198,
             (int *)&local_1f8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x24,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f8.m_message._M_dataplus._M_p._0_4_ = iutest::detail::wrapper::iu_stricmp("AAAa","aaa");
  iutest::internal::CmpHelperLT<int,int>
            (&iutest_ar,(internal *)0x169a26,
             "::iutest::detail::wrapper::iu_stricmp(\"AAAa\", \"aaa\")",(char *)&local_198,
             (int *)&local_1f8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x25,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f8.m_message._M_dataplus._M_p._0_4_ = iutest::detail::wrapper::iu_stricmp("AAAB","aaaa");
  iutest::internal::CmpHelperLT<int,int>
            (&iutest_ar,(internal *)0x169a26,
             "::iutest::detail::wrapper::iu_stricmp(\"AAAB\", \"aaaa\")",(char *)&local_198,
             (int *)&local_1f8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x26,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f8.m_message._M_dataplus._M_p._0_4_ = iutest::detail::wrapper::iu_stricmp("AAAA","aaab");
  iutest::internal::CmpHelperGT<int,int>
            (&iutest_ar,(internal *)0x169a26,
             "::iutest::detail::wrapper::iu_stricmp(\"AAAA\", \"aaab\")",(char *)&local_198,
             (int *)&local_1f8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x27,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f8.m_message._M_dataplus._M_p._0_4_ =
       iutest::detail::wrapper::iu_stricmp("AAA",negative_sample);
  iutest::internal::CmpHelperGT<int,int>
            (&iutest_ar,(internal *)0x169a26,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", negative_sample)",(char *)&local_198,
             (int *)&local_1f8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x28,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  local_1f8.m_message._M_dataplus._M_p._0_4_ = iutest::detail::wrapper::iu_stricmp("AAA","aaaA");
  iutest::internal::CmpHelperGT<int,int>
            (&iutest_ar,(internal *)0x169a26,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaaA\")",(char *)&local_198,
             (int *)&local_1f8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x29,iutest_ar.m_message._M_dataplus._M_p);
    local_1f8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f8,&local_198);
    std::__cxx11::string::~string((string *)&local_1f8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnStricmp)
{
    const char negative = static_cast<char>(-1);
    const char negative_sample[] = { 'a', 'a', 'a', negative, '\0' };
    IUTEST_EXPECT_EQ(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAa", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAB", "aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAAA", "aaab"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", negative_sample));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaaA"));
}